

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::
ArrayBuilder<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>::
truncate(ArrayBuilder<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
         *this,char *__file,__off_t __length)

{
  Entry *pEVar1;
  char *pcVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  Entry *pEVar5;
  Entry *pEVar6;
  
  pEVar1 = this->ptr;
  pEVar6 = this->pos;
  while (pEVar5 = pEVar6, pEVar1 + (long)__file < pEVar5) {
    this->pos = pEVar5 + -1;
    pcVar2 = pEVar5[-1].value.ownName.content.ptr;
    pEVar6 = pEVar5 + -1;
    if (pcVar2 != (char *)0x0) {
      sVar3 = pEVar5[-1].value.ownName.content.size_;
      pEVar5[-1].value.ownName.content.ptr = (char *)0x0;
      pEVar5[-1].value.ownName.content.size_ = 0;
      pAVar4 = pEVar5[-1].value.ownName.content.disposer;
      (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar2,1,sVar3,sVar3,0);
      pEVar6 = this->pos;
    }
  }
  return (int)pEVar5;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }